

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::LSR_ZP(CPU *this)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  
  this->cycles = 5;
  uVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 2;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(uVar1 & 0xff));
  bVar3 = (byte)iVar2;
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (bVar3 < 2) * '\x02' | (this->field_6).ps & 0x7c | bVar3 & 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)(uVar1 & 0xff),(ulong)(bVar3 >> 1));
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::LSR_ZP()
{
    cycles = 5;
    uint8_t addr = GetByte();
    uint8_t data = ReadByte(addr);
    C = (data & 0b00000001) > 0;
    data >>= 1;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}